

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_color_hsva_f(float *out_h,float *out_s,float *out_v,float *out_a,nk_color in)

{
  uint6 uVar1;
  nk_colorf in_00;
  
  uVar1 = CONCAT24(in._1_2_,in) & 0xff000000ff;
  in_00.r = (float)(int)uVar1 * 0.003921569;
  in_00.g = (float)(ushort)(uVar1 >> 0x20) * 0.003921569;
  in_00.b = (float)((uint)in >> 0x10 & 0xff) * 0.003921569;
  in_00.a = (float)((uint)in >> 0x18) * 0.003921569;
  nk_colorf_hsva_f(out_h,out_s,out_v,out_a,in_00);
  return;
}

Assistant:

NK_API void
nk_color_hsva_f(float *out_h, float *out_s,
    float *out_v, float *out_a, struct nk_color in)
{
    struct nk_colorf col;
    nk_color_f(&col.r,&col.g,&col.b,&col.a, in);
    nk_colorf_hsva_f(out_h, out_s, out_v, out_a, col);
}